

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_queue.cpp
# Opt level: O2

uint32_t part1_by1(uint32_t x)

{
  uint uVar1;
  
  uVar1 = x & 0xff | (x & 0xff00) << 8;
  uVar1 = (uVar1 << 4 | uVar1) & 0xf0f0f0f;
  uVar1 = (uVar1 * 4 | uVar1) & 0x33333333;
  return (uVar1 * 2 | uVar1) & 0x55555555;
}

Assistant:

static uint32_t part1_by1(uint32_t x){
	x &= 0x0000ffff;
	x = (x ^ (x << 8)) & 0x00ff00ff;
	x = (x ^ (x << 4)) & 0x0f0f0f0f;
	x = (x ^ (x << 2)) & 0x33333333;
	x = (x ^ (x << 1)) & 0x55555555;
	return x;
}